

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * classic_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  loc_conflict to_avoid;
  bool bVar2;
  room_profile profile_00;
  undefined8 uVar3;
  _Bool _Var4;
  int16_t iVar5;
  uint32_t uVar6;
  int iVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  wchar_t wVar10;
  quest *pqVar11;
  _Bool **pp_Var12;
  _Bool *p_Var13;
  void *p_00;
  void *pvVar14;
  uint32_t local_d4;
  uint32_t local_d0;
  int local_cc;
  undefined8 uStack_a8;
  room_profile profile;
  chunk_conflict *c;
  _Bool **blocks_tried;
  int local_58;
  wchar_t dun_unusual;
  wchar_t size_percent;
  wchar_t num_rooms;
  wchar_t built;
  wchar_t rarity;
  wchar_t key;
  wchar_t tbx;
  wchar_t tby;
  wchar_t bx;
  wchar_t by;
  wchar_t k;
  wchar_t j;
  wchar_t i;
  char **p_error_local;
  wchar_t min_width_local;
  wchar_t min_height_local;
  player *p_local;
  
  wVar10 = dun->profile->dun_unusual;
  uVar6 = Rand_div(10);
  iVar7 = uVar6 + 1 + (int)p->depth / 0x18;
  pqVar11 = find_quest((int)p->place);
  if (pqVar11 == (quest *)0x0) {
    if (iVar7 < 2) {
      local_58 = 0x4b;
    }
    else if (iVar7 < 3) {
      local_58 = 0x50;
    }
    else if (iVar7 < 4) {
      local_58 = 0x55;
    }
    else if (iVar7 < 5) {
      local_58 = 0x5a;
    }
    else if (iVar7 < 6) {
      local_58 = 0x5f;
    }
    else {
      local_58 = 100;
    }
  }
  else {
    local_58 = 100;
  }
  wVar8 = (dun->profile->dun_rooms * local_58) / 100;
  dun->block_hgt = dun->profile->block_size;
  dun->block_wid = dun->profile->block_size;
  profile._48_8_ = cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  ((chunk_conflict *)profile._48_8_)->depth = (int)p->depth;
  ((chunk_conflict *)profile._48_8_)->place = (int)p->place;
  if (((player->opts).opt[0x18] & 1U) != 0) {
    msg("height=%d  width=%d  nrooms=%d",(ulong)(uint)((chunk_conflict *)profile._48_8_)->height,
        (ulong)(uint)((chunk_conflict *)profile._48_8_)->width,(ulong)(uint)wVar8);
  }
  fill_rectangle((chunk_conflict *)profile._48_8_,L'\0',L'\0',
                 *(int *)(profile._48_8_ + 0x24) + L'\xffffffff',
                 *(int *)(profile._48_8_ + 0x28) + L'\xffffffff',FEAT_GRANITE,L'\0');
  dun->row_blocks = *(int *)(profile._48_8_ + 0x24) / dun->block_hgt;
  dun->col_blocks = *(int *)(profile._48_8_ + 0x28) / dun->block_wid;
  pp_Var12 = (_Bool **)mem_zalloc((long)dun->row_blocks << 3);
  dun->room_map = pp_Var12;
  for (k = L'\0'; k < dun->row_blocks; k = k + L'\x01') {
    p_Var13 = (_Bool *)mem_zalloc((long)dun->col_blocks);
    dun->room_map[k] = p_Var13;
  }
  p_00 = mem_zalloc((long)dun->row_blocks << 3);
  for (k = L'\0'; k < dun->row_blocks; k = k + L'\x01') {
    pvVar14 = mem_zalloc((long)dun->col_blocks);
    *(void **)((long)p_00 + (long)k * 8) = pvVar14;
  }
  dun->pit_num = L'\0';
  dun->cent_n = L'\0';
  reset_entrance_data((chunk_conflict *)profile._48_8_);
  if ((dun->persist & 1U) != 0) {
    build_staircase_rooms((chunk_conflict *)profile._48_8_,"Classic Generation");
  }
  size_percent = L'\0';
  do {
    if (wVar8 <= size_percent) {
LAB_0015b146:
      for (k = L'\0'; k < dun->row_blocks; k = k + L'\x01') {
        mem_free(*(void **)((long)p_00 + (long)k * 8));
        mem_free(dun->room_map[k]);
      }
      mem_free(p_00);
      mem_free(dun->room_map);
      draw_rectangle((chunk_conflict *)profile._48_8_,L'\0',L'\0',
                     *(int *)(profile._48_8_ + 0x24) + L'\xffffffff',
                     *(int *)(profile._48_8_ + 0x28) + L'\xffffffff',FEAT_PERM,L'\0',true);
      do_traditional_tunneling((chunk_conflict *)profile._48_8_);
      ensure_connectedness((chunk_conflict *)profile._48_8_,true);
      for (k = L'\0'; k < (dun->profile->str).mag; k = k + L'\x01') {
        build_streamer((chunk_conflict *)profile._48_8_,FEAT_MAGMA,(dun->profile->str).mc);
      }
      for (k = L'\0'; uVar3 = profile._48_8_, k < (dun->profile->str).qua; k = k + L'\x01') {
        build_streamer((chunk_conflict *)profile._48_8_,FEAT_QUARTZ,(dun->profile->str).qc);
      }
      _Var4 = dun->persist;
      wVar10 = rand_range(3,4);
      wVar8 = rand_range(1,2);
      handle_level_stairs((chunk_conflict *)uVar3,(_Bool)(_Var4 & 1),wVar10,wVar8);
      uVar3 = profile._48_8_;
      if (*(int *)(profile._48_8_ + 0xc) / 3 < 0xb) {
        local_cc = *(int *)(profile._48_8_ + 0xc) / 3;
      }
      else {
        local_cc = 10;
      }
      if (local_cc < 2) {
        local_d0 = 2;
      }
      else {
        if (*(int *)(profile._48_8_ + 0xc) / 3 < 0xb) {
          local_d4 = *(int *)(profile._48_8_ + 0xc) / 3;
        }
        else {
          local_d4 = 10;
        }
        local_d0 = local_d4;
      }
      uVar6 = Rand_div(local_d0);
      alloc_objects((chunk_conflict *)uVar3,L'\x01',L'\0',uVar6 + L'\x01',
                    *(wchar_t *)(profile._48_8_ + 0xc),'\0');
      uVar3 = profile._48_8_;
      uVar6 = Rand_div(local_d0);
      alloc_objects((chunk_conflict *)uVar3,L'\x01',L'\x01',(int)(uVar6 + 1) / 5,
                    *(wchar_t *)(profile._48_8_ + 0xc),'\0');
      _Var4 = new_player_spot((chunk_conflict *)profile._48_8_,p);
      if (_Var4) {
        uVar1 = z_info->level_monster_min;
        uVar6 = Rand_div(8);
        for (k = (uint)uVar1 + uVar6 + 1 + local_d0; uVar3 = profile._48_8_, L'\0' < k;
            k = k + L'\xffffffff') {
          to_avoid.x = (p->grid).x;
          to_avoid.y = (p->grid).y;
          pick_and_place_distant_monster
                    ((chunk *)profile._48_8_,to_avoid,L'\0',true,*(wchar_t *)(profile._48_8_ + 0xc))
          ;
        }
        iVar5 = Rand_normal((uint)z_info->room_item_av,3);
        alloc_objects((chunk_conflict *)uVar3,L'\x02',L'\x03',(int)iVar5,
                      *(wchar_t *)(profile._48_8_ + 0xc),'\x01');
        uVar3 = profile._48_8_;
        iVar5 = Rand_normal((uint)z_info->both_item_av,3);
        alloc_objects((chunk_conflict *)uVar3,L'\x03',L'\x03',(int)iVar5,
                      *(wchar_t *)(profile._48_8_ + 0xc),'\x01');
        uVar3 = profile._48_8_;
        iVar5 = Rand_normal((uint)z_info->both_gold_av,3);
        alloc_objects((chunk_conflict *)uVar3,L'\x03',L'\x02',(int)iVar5,
                      *(wchar_t *)(profile._48_8_ + 0xc),'\x01');
        p_local = (player *)profile._48_8_;
      }
      else {
        uncreate_artifacts((chunk_conflict *)profile._48_8_);
        wipe_mon_list((chunk *)profile._48_8_,p);
        cave_free((chunk_conflict *)profile._48_8_);
        *p_error = "could not place player";
        p_local = (player *)0x0;
      }
      return (chunk_conflict *)p_local;
    }
    by = L'\0';
    key = L'\0';
    rarity = L'\0';
    for (tby = L'\0'; tby < dun->row_blocks; tby = tby + L'\x01') {
      for (tbx = L'\0'; tbx < dun->col_blocks; tbx = tbx + L'\x01') {
        if ((*(byte *)(*(long *)((long)p_00 + (long)tby * 8) + (long)tbx) & 1) == 0) {
          by = by + L'\x01';
          uVar6 = Rand_div(by);
          if (uVar6 == 0) {
            key = tby;
            rarity = tbx;
          }
        }
      }
    }
    if (by == L'\0') goto LAB_0015b146;
    if ((*(byte *)(*(long *)((long)p_00 + (long)key * 8) + (long)rarity) & 1) != 0) {
      quit_fmt("generation: inconsistent blocks");
    }
    *(undefined1 *)(*(long *)((long)p_00 + (long)key * 8) + (long)rarity) = 1;
    uVar6 = Rand_div(100);
    k = L'\0';
    num_rooms = L'\0';
    while( true ) {
      bVar2 = false;
      if (k == num_rooms) {
        bVar2 = k < dun->profile->max_rarity;
      }
      if (!bVar2) break;
      uVar9 = Rand_div(wVar10);
      if ((int)uVar9 < *(int *)(profile._48_8_ + 0xc) / 2 + 0x32) {
        num_rooms = num_rooms + L'\x01';
      }
      k = k + L'\x01';
    }
    for (k = L'\0'; k < dun->profile->n_room_profiles; k = k + L'\x01') {
      memcpy(&uStack_a8,dun->profile->room_profiles + k,0x38);
      if (((profile.level <= num_rooms) && ((int)uVar6 < (int)profile._40_4_)) &&
         (profile_00._52_4_ = profile.rarity, profile_00.cutoff = profile._40_4_,
         profile_00.rarity = profile.level, profile_00._40_4_ = profile.width,
         profile_00.name._0_4_ = (int)profile.next, profile_00.next = (room_profile *)uStack_a8,
         profile_00.name._4_4_ = (int)((ulong)profile.next >> 0x20),
         profile_00.builder = (room_builder_conflict)profile.name,
         profile_00._24_8_ = profile.builder, profile_00.width = profile.rating,
         profile_00.level = profile.height,
         _Var4 = room_build((chunk_conflict *)profile._48_8_,key,rarity,profile_00,false), _Var4)) {
        size_percent = size_percent + L'\x01';
        break;
      }
    }
  } while( true );
}

Assistant:

struct chunk *classic_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, j, k;
	int by, bx = 0, tby, tbx, key, rarity, built;
	int num_rooms, size_percent;
	int dun_unusual = dun->profile->dun_unusual;

	bool **blocks_tried;
	struct chunk *c;

	/* This code currently does nothing - see comments below */
	i = randint1(10) + p->depth / 24;
	if (find_quest(p->place)) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;

	/* scale the various generation variables */
	num_rooms = (dun->profile->dun_rooms * size_percent) / 100;
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;
	c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;
	ROOM_LOG("height=%d  width=%d  nrooms=%d", c->height, c->width, num_rooms);

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_GRANITE, SQUARE_NONE);

	/* Actual maximum number of rooms on this level */
	dun->row_blocks = c->height / dun->block_hgt;
	dun->col_blocks = c->width / dun->block_wid;

	/* Initialize the room table */
	dun->room_map = mem_zalloc(dun->row_blocks * sizeof(bool*));
	for (i = 0; i < dun->row_blocks; i++)
		dun->room_map[i] = mem_zalloc(dun->col_blocks * sizeof(bool));

	/* Initialize the block table */
	blocks_tried = mem_zalloc(dun->row_blocks * sizeof(bool*));

	for (i = 0; i < dun->row_blocks; i++)
		blocks_tried[i] = mem_zalloc(dun->col_blocks * sizeof(bool));

	/* No rooms yet, pits or otherwise. */
	dun->pit_num = 0;
	dun->cent_n = 0;
	reset_entrance_data(c);

	/* Build the special staircase rooms */
	if (dun->persist) {
		build_staircase_rooms(c, "Classic Generation");
	}

	/* Build some rooms.  Note that the theoretical maximum number of rooms
	 * in this profile is currently 36, so built never reaches num_rooms,
	 * and room generation is always terminated by having tried all blocks */
	built = 0;
	while(built < num_rooms) {

		/* Count the room blocks we haven't tried yet. */
		j = 0;
		tby = 0;
		tbx = 0;
		for(by = 0; by < dun->row_blocks; by++) {
			for(bx = 0; bx < dun->col_blocks; bx++) {
				if (blocks_tried[by][bx]) continue;
				j++;
				if (one_in_(j)) {
					tby = by;
					tbx = bx;
				}
			} 
		}
		bx = tbx;
		by = tby;

		/* If we've tried all blocks we're done. */
		if (j == 0) break;

		if (blocks_tried[by][bx]) quit_fmt("generation: inconsistent blocks");

		/* Mark that we are trying this block. */
		blocks_tried[by][bx] = true;

		/* Roll for random key (to be compared against a profile's cutoff) */
		key = randint0(100);

		/* We generate a rarity number to figure out how exotic to make
		 * the room. This number has a (50+depth/2)/DUN_UNUSUAL chance
		 * of being > 0, a (50+depth/2)^2/DUN_UNUSUAL^2 chance of
		 * being > 1, up to MAX_RARITY. */
		i = 0;
		rarity = 0;
		while (i == rarity && i < dun->profile->max_rarity) {
			if (randint0(dun_unusual) < 50 + c->depth / 2) rarity++;
			i++;
		}

		/* Once we have a key and a rarity, we iterate through out list of
		 * room profiles looking for a match (whose cutoff > key and whose
		 * rarity > this rarity). We try building the room, and if it works
		 * then we are done with this iteration. We keep going until we find
		 * a room that we can build successfully or we exhaust the profiles. */
		for (i = 0; i < dun->profile->n_room_profiles; i++) {
			struct room_profile profile = dun->profile->room_profiles[i];
			if (profile.rarity > rarity) continue;
			if (profile.cutoff <= key) continue;
			
			if (room_build(c, by, bx, profile, false)) {
				built++;
				break;
			}
		}
	}

	for (i = 0; i < dun->row_blocks; i++){
		mem_free(blocks_tried[i]);
		mem_free(dun->room_map[i]);
	}
	mem_free(blocks_tried);
	mem_free(dun->room_map);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect all the rooms together */
	do_traditional_tunneling(c);
	ensure_connectedness(c, true);

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(c, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(c, FEAT_QUARTZ, dun->profile->str.qc);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, rand_range(3, 4), rand_range(1, 2));

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}